

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
r_code::list<unsigned_short>::push_back(list<unsigned_short> *this,unsigned_short *t)

{
  unsigned_short *t_local;
  list<unsigned_short> *this_local;
  
  if (this->free_cell_count == 0) {
    push_back_new_cell(this,t);
  }
  else {
    push_back_free_cell(this,t);
  }
  update_used_cells_tail_state(this);
  return;
}

Assistant:

void push_back(const T &t)
    {
        if (free_cell_count) {
            push_back_free_cell(t);
        } else {
            push_back_new_cell(t);
        }

        update_used_cells_tail_state();
    }